

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)202>(Result *__return_storage_ptr__,Model *pipeline)

{
  Pipeline *pipelineParams;
  Model *pipeline_local;
  
  pipelineParams = Specification::Model::pipeline(pipeline);
  validate(__return_storage_ptr__,pipeline,pipelineParams);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_pipeline>(const Specification::Model& pipeline) {
        return validate(pipeline, pipeline.pipeline());
    }